

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
duckdb::SumNoOverflowBind
          (ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  BinderException *this;
  string local_40;
  
  this = (BinderException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"sum_no_overflow is for internal use only!","");
  BinderException::BinderException(this,&local_40);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<FunctionData> SumNoOverflowBind(ClientContext &context, AggregateFunction &function,
                                           vector<unique_ptr<Expression>> &arguments) {
	throw BinderException("sum_no_overflow is for internal use only!");
}